

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::DescribeParser::DoHeaderLine(DescribeParser *this)

{
  RegularExpression *this_00;
  cmCTestP4 *this_01;
  bool bVar1;
  string sStack_c8;
  User user;
  
  this_00 = &this->RegexHeader;
  bVar1 = cmsys::RegularExpression::find(this_00,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&user.UserName,this_00,1);
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)&user);
    std::__cxx11::string::~string((string *)&user);
    cmsys::RegularExpression::match_abi_cxx11_(&user.UserName,this_00,4);
    std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&user);
    std::__cxx11::string::~string((string *)&user);
    this_01 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_c8,this_00,2);
    GetUserData(&user,this_01,&sStack_c8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).Author);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).EMail);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).Committer);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitterEMail);
    std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitDate);
    User::~User(&user);
  }
  return;
}

Assistant:

void DoHeaderLine()
    {
    if(this->RegexHeader.find(this->Line))
      {
      this->Rev.Rev = this->RegexHeader.match(1);
      this->Rev.Date = this->RegexHeader.match(4);

      cmCTestP4::User user = P4->GetUserData(this->RegexHeader.match(2));
      this->Rev.Author = user.Name;
      this->Rev.EMail = user.EMail;

      this->Rev.Committer = this->Rev.Author;
      this->Rev.CommitterEMail = this->Rev.EMail;
      this->Rev.CommitDate = this->Rev.Date;
      }
    }